

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

base_learner * lda_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  option_group_definition *poVar4;
  typed_option<float> *ptVar5;
  typed_option<unsigned_long> *ptVar6;
  typed_option<int> *ptVar7;
  ostream *poVar8;
  size_t ring_size;
  parser *ppVar9;
  learner<lda,_example> *plVar10;
  long lVar11;
  uint32_t *puVar12;
  code *predict;
  undefined **ppuVar13;
  code *learn;
  label_parser *plVar14;
  _Head_base<0UL,_lda_*,_false> _Var15;
  size_t x;
  bool bVar16;
  byte bVar17;
  float fVar18;
  free_ptr<lda> ld;
  allocator local_ca4;
  allocator local_ca3;
  allocator local_ca2;
  allocator local_ca1;
  allocator local_ca0;
  allocator local_c9f;
  allocator local_c9e;
  allocator local_c9d;
  allocator local_c9c;
  allocator local_c9b;
  allocator local_c9a;
  allocator local_c99;
  allocator local_c98;
  allocator local_c97;
  allocator local_c96;
  allocator local_c95;
  int math_mode;
  string local_c90 [32];
  string local_c70;
  string local_c50 [32];
  string local_c30;
  string local_c10 [32];
  string local_bf0;
  string local_bd0 [32];
  string local_bb0;
  string local_b90 [32];
  string local_b70;
  string local_b50 [32];
  string local_b30;
  string local_b10 [32];
  string local_af0;
  string local_ad0 [32];
  string local_ab0;
  string local_a90;
  option_group_definition new_options;
  undefined1 local_a38 [112];
  bool local_9c8;
  undefined1 local_990 [160];
  typed_option<float> local_8f0;
  typed_option<bool> local_850;
  typed_option<int> local_7b0;
  typed_option<int> local_710;
  typed_option<unsigned_long> local_670;
  typed_option<unsigned_long> local_5d0;
  typed_option<float> local_530;
  typed_option<float> local_490;
  typed_option<float> local_3f0;
  typed_option<float> local_350;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<unsigned_long> local_d0;
  
  bVar17 = 0;
  scoped_calloc_or_throw<lda>();
  std::__cxx11::string::string
            ((string *)&local_a90,"Latent Dirichlet Allocation",(allocator *)local_a38);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_a90);
  std::__cxx11::string::~string((string *)&local_a90);
  std::__cxx11::string::string((string *)&local_ab0,"lda",&local_c95);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_a38,&local_ab0,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->topics);
  local_9c8 = true;
  std::__cxx11::string::string(local_ad0,"Run lda with <int> topics",&local_c96);
  std::__cxx11::string::_M_assign((string *)(local_a38 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,(typed_option<unsigned_long> *)local_a38);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_d0);
  std::__cxx11::string::string((string *)&local_af0,"lda_alpha",&local_c97);
  VW::config::typed_option<float>::typed_option
            (&local_8f0,&local_af0,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->lda_alpha);
  local_8f0.super_base_option.m_keep = true;
  ptVar5 = VW::config::typed_option<float>::default_value(&local_8f0,0.1);
  std::__cxx11::string::string
            (local_b10,"Prior on sparsity of per-document topic weights",&local_c98);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_170,ptVar5);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_170);
  std::__cxx11::string::string((string *)&local_b30,"lda_rho",&local_c99);
  VW::config::typed_option<float>::typed_option
            (&local_2b0,&local_b30,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->lda_rho);
  local_2b0.super_base_option.m_keep = true;
  ptVar5 = VW::config::typed_option<float>::default_value(&local_2b0,0.1);
  std::__cxx11::string::string(local_b50,"Prior on sparsity of topic distributions",&local_c9a);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_210,ptVar5);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_210);
  std::__cxx11::string::string((string *)&local_b70,"lda_D",&local_c9b);
  VW::config::typed_option<float>::typed_option
            (&local_3f0,&local_b70,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->lda_D);
  ptVar5 = VW::config::typed_option<float>::default_value(&local_3f0,10000.0);
  std::__cxx11::string::string(local_b90,"Number of documents",&local_c9c);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_350,ptVar5);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_350);
  std::__cxx11::string::string((string *)&local_bb0,"lda_epsilon",&local_c9d);
  VW::config::typed_option<float>::typed_option
            (&local_530,&local_bb0,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->lda_epsilon);
  ptVar5 = VW::config::typed_option<float>::default_value(&local_530,0.001);
  std::__cxx11::string::string(local_bd0,"Loop convergence threshold",&local_c9e);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_490,ptVar5);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_490);
  std::__cxx11::string::string((string *)&local_bf0,"minibatch",&local_c9f);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_670,&local_bf0,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->minibatch);
  ptVar6 = VW::config::typed_option<unsigned_long>::default_value(&local_670,1);
  std::__cxx11::string::string(local_c10,"Minibatch size, for LDA",&local_ca0);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_5d0,ptVar6);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_5d0);
  std::__cxx11::string::string((string *)&local_c30,"math-mode",&local_ca1);
  VW::config::typed_option<int>::typed_option(&local_7b0,&local_c30,&math_mode);
  ptVar7 = VW::config::typed_option<int>::default_value(&local_7b0,0);
  std::__cxx11::string::string(local_c50,"Math mode: simd, accuracy, fast-approx",&local_ca2);
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_710,ptVar7);
  poVar4 = VW::config::option_group_definition::add<int>(poVar4,&local_710);
  std::__cxx11::string::string((string *)&local_c70,"metrics",&local_ca3);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_990,&local_c70,
             &(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
              _M_head_impl)->compute_coherence_metrics);
  std::__cxx11::string::string(local_c90,"Compute metrics",&local_ca4);
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_850,(typed_option<bool> *)local_990);
  VW::config::option_group_definition::add<bool>(poVar4,&local_850);
  VW::config::typed_option<bool>::~typed_option(&local_850);
  std::__cxx11::string::~string(local_c90);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_990);
  std::__cxx11::string::~string((string *)&local_c70);
  VW::config::typed_option<int>::~typed_option(&local_710);
  std::__cxx11::string::~string(local_c50);
  VW::config::typed_option<int>::~typed_option(&local_7b0);
  std::__cxx11::string::~string((string *)&local_c30);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_5d0);
  std::__cxx11::string::~string(local_c10);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_670);
  std::__cxx11::string::~string((string *)&local_bf0);
  VW::config::typed_option<float>::~typed_option(&local_490);
  std::__cxx11::string::~string(local_bd0);
  VW::config::typed_option<float>::~typed_option(&local_530);
  std::__cxx11::string::~string((string *)&local_bb0);
  VW::config::typed_option<float>::~typed_option(&local_350);
  std::__cxx11::string::~string(local_b90);
  VW::config::typed_option<float>::~typed_option(&local_3f0);
  std::__cxx11::string::~string((string *)&local_b70);
  VW::config::typed_option<float>::~typed_option(&local_210);
  std::__cxx11::string::~string(local_b50);
  VW::config::typed_option<float>::~typed_option(&local_2b0);
  std::__cxx11::string::~string((string *)&local_b30);
  VW::config::typed_option<float>::~typed_option(&local_170);
  std::__cxx11::string::~string(local_b10);
  VW::config::typed_option<float>::~typed_option(&local_8f0);
  std::__cxx11::string::~string((string *)&local_af0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_d0);
  std::__cxx11::string::~string(local_ad0);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_a38);
  std::__cxx11::string::~string((string *)&local_ab0);
  (**options->_vptr_options_i)(options,&new_options);
  (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>._M_head_impl)
  ->mmode = math_mode;
  std::__cxx11::string::string((string *)local_a38,"lda",(allocator *)&local_8f0);
  iVar3 = (*options->_vptr_options_i[1])(options,local_a38);
  std::__cxx11::string::~string((string *)local_a38);
  if ((char)iVar3 == '\0') {
    plVar10 = (learner<lda,_example> *)0x0;
  }
  else {
    all->lda = (uint32_t)
               (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
               _M_head_impl)->topics;
    all->delete_prediction = delete_scalars;
    local_a38._0_8_ = (pointer)0x0;
    local_a38._8_8_ = (pointer)0x0;
    local_a38._16_8_ = (pointer)0x0;
    std::vector<index_feature,_std::allocator<index_feature>_>::_M_move_assign
              (&(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>
                ._M_head_impl)->sorted_features,
               (_Vector_base<index_feature,_std::allocator<index_feature>_> *)local_a38);
    std::_Vector_base<index_feature,_std::allocator<index_feature>_>::~_Vector_base
              ((_Vector_base<index_feature,_std::allocator<index_feature>_> *)local_a38);
    (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
    _M_head_impl)->total_lambda_init = false;
    (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
    _M_head_impl)->all = all;
    (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
    _M_head_impl)->example_t = (double)all->initial_t;
    if ((ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
        _M_head_impl)->compute_coherence_metrics == true) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.
                   super__Head_base<0UL,_lda_*,_false>._M_head_impl)->feature_counts,
                 1L << ((byte)all->num_bits & 0x3f) & 0xffffffff);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::resize(&(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>
                ._M_head_impl)->feature_to_example_map,
               1L << ((byte)all->num_bits & 0x3f) & 0xffffffff);
    }
    fVar18 = logf((float)(all->lda * 2 + 1));
    fVar18 = ceilf(fVar18 / 0.6931472);
    parameters::stride_shift
              (&all->weights,
               (uint)(long)fVar18 |
               (uint)(long)(fVar18 - 9.223372e+18) & (uint)((long)fVar18 >> 0x3f));
    all->random_weights = true;
    all->add_constant = false;
    if (1.0 < all->eta) {
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "your learning rate is too high, setting it to 1");
      std::endl<char,std::char_traits<char>>(poVar8);
      fVar18 = 1.0;
      if (all->eta <= 1.0) {
        fVar18 = all->eta;
      }
      all->eta = fVar18;
    }
    _Var15._M_head_impl =
         ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
         _M_head_impl;
    x = (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
        _M_head_impl)->minibatch;
    ring_size = next_pow2(x);
    ppVar9 = all->p;
    if (ppVar9->ring_size < ring_size) {
      parser::~parser(ppVar9);
      operator_delete(ppVar9);
      ppVar9 = (parser *)operator_new(0x390);
      parser::parser(ppVar9,ring_size);
      all->p = ppVar9;
      x = (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
          _M_head_impl)->minibatch;
      _Var15 = ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>;
    }
    v_array<float>::resize(&(_Var15._M_head_impl)->v,all->lda * x);
    local_a38._0_8_ = local_a38._0_8_ & 0xffffffff00000000;
    v_array<float>::push_back
              (&(ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>
                ._M_head_impl)->decay_levels,(float *)local_a38);
    ppuVar13 = &no_label::no_label_parser;
    plVar14 = &all->p->lp;
    for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
      plVar14->default_label = (_func_void_void_ptr *)*ppuVar13;
      ppuVar13 = ppuVar13 + (ulong)bVar17 * -2 + 1;
      plVar14 = (label_parser *)((long)plVar14 + (ulong)bVar17 * -0x10 + 8);
    }
    predict = ::predict;
    bVar16 = (ld._M_t.super___uniq_ptr_impl<lda,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_lda_*,_void_(*)(void_*)>.super__Head_base<0UL,_lda_*,_false>.
             _M_head_impl)->compute_coherence_metrics != false;
    if (bVar16) {
      predict = predict_with_metrics;
    }
    learn = ::learn;
    if (bVar16) {
      learn = learn_with_metrics;
    }
    puVar12 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar12 = &(all->weights).sparse_weights._stride_shift;
    }
    plVar10 = LEARNER::init_learner<lda,example,LEARNER::learner<char,example>>
                        (&ld,learn,predict,1L << ((byte)*puVar12 & 0x3f),scalars);
    *(code **)(plVar10 + 0x80) = save_load;
    uVar1 = *(undefined8 *)(plVar10 + 0x18);
    uVar2 = *(undefined8 *)(plVar10 + 0x20);
    *(undefined8 *)(plVar10 + 0x70) = uVar1;
    *(undefined8 *)(plVar10 + 0x78) = uVar2;
    *(undefined8 *)(plVar10 + 0x58) = uVar1;
    *(code **)(plVar10 + 0x68) = finish_example;
    *(undefined8 *)(plVar10 + 0xa0) = uVar1;
    *(undefined8 *)(plVar10 + 0xa8) = uVar2;
    *(code **)(plVar10 + 0xb0) = end_examples;
    *(undefined8 *)(plVar10 + 0x88) = uVar1;
    *(undefined8 *)(plVar10 + 0x90) = uVar2;
    *(code **)(plVar10 + 0x98) = end_pass;
    *(undefined8 *)(plVar10 + 0xb8) = uVar1;
    *(undefined8 *)(plVar10 + 0xc0) = uVar2;
    *(code **)(plVar10 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<lda,_void_(*)(void_*)>::~unique_ptr(&ld);
  return (base_learner *)plVar10;
}

Assistant:

LEARNER::base_learner *lda_setup(options_i &options, vw &all)
{
  auto ld = scoped_calloc_or_throw<lda>();
  option_group_definition new_options("Latent Dirichlet Allocation");
  int math_mode;
  new_options.add(make_option("lda", ld->topics).keep().help("Run lda with <int> topics"))
      .add(make_option("lda_alpha", ld->lda_alpha)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of per-document topic weights"))
      .add(make_option("lda_rho", ld->lda_rho)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of topic distributions"))
      .add(make_option("lda_D", ld->lda_D).default_value(10000.0f).help("Number of documents"))
      .add(make_option("lda_epsilon", ld->lda_epsilon).default_value(0.001f).help("Loop convergence threshold"))
      .add(make_option("minibatch", ld->minibatch).default_value(1).help("Minibatch size, for LDA"))
      .add(make_option("math-mode", math_mode).default_value(USE_SIMD).help("Math mode: simd, accuracy, fast-approx"))
      .add(make_option("metrics", ld->compute_coherence_metrics).help("Compute metrics"));
  options.add_and_parse(new_options);

  // Convert from int to corresponding enum value.
  ld->mmode = static_cast<lda_math_mode>(math_mode);

  if (!options.was_supplied("lda"))
    return nullptr;

  all.lda = (uint32_t)ld->topics;
  all.delete_prediction = delete_scalars;
  ld->sorted_features = std::vector<index_feature>();
  ld->total_lambda_init = 0;
  ld->all = &all;
  ld->example_t = all.initial_t;
  if (ld->compute_coherence_metrics)
  {
    ld->feature_counts.resize((uint32_t)(UINT64_ONE << all.num_bits));
    ld->feature_to_example_map.resize((uint32_t)(UINT64_ONE << all.num_bits));
  }

  float temp = ceilf(logf((float)(all.lda * 2 + 1)) / logf(2.f));

  all.weights.stride_shift((size_t)temp);
  all.random_weights = true;
  all.add_constant = false;

  if (all.eta > 1.)
  {
    std::cerr << "your learning rate is too high, setting it to 1" << std::endl;
    all.eta = min(all.eta, 1.f);
  }

  size_t minibatch2 = next_pow2(ld->minibatch);
  if(minibatch2 > all.p->ring_size)
  {
    delete all.p;
    all.p = new parser{minibatch2};
  }

  ld->v.resize(all.lda * ld->minibatch);

  ld->decay_levels.push_back(0.f);

  all.p->lp = no_label::no_label_parser;

  LEARNER::learner<lda, example> &l = init_learner(ld, ld->compute_coherence_metrics ? learn_with_metrics : learn,
      ld->compute_coherence_metrics ? predict_with_metrics : predict, UINT64_ONE << all.weights.stride_shift(),
      prediction_type::scalars);

  l.set_save_load(save_load);
  l.set_finish_example(finish_example);
  l.set_end_examples(end_examples);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}